

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O1

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_element<0>(xml_document<char> *this,char **text)

{
  byte *pbVar1;
  char cVar2;
  xml_node<char> *node;
  char *pcVar3;
  parse_error *this_00;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  pointer_____offset_0x10___ *ppuVar7;
  
  node = memory_pool<char>::allocate_node
                   (&this->super_memory_pool<char>,node_element,(char *)0x0,(char *)0x0,0,0);
  pcVar3 = *text;
  sVar4 = 0xffffffffffffffff;
  do {
    lVar5 = sVar4 + 1;
    sVar4 = sVar4 + 1;
  } while (internal::lookup_tables<0>::lookup_element_name[(byte)pcVar3[lVar5]] != '\0');
  *text = pcVar3 + sVar4;
  cVar2 = pcVar3[sVar4];
  if (sVar4 == 0) {
    this_00 = (parse_error *)__cxa_allocate_exception(0x18);
    if (cVar2 != '\0') {
      parse_error::parse_error(this_00,"expected element name or prefix",*text);
LAB_0012360a:
      ppuVar7 = &parse_error::typeinfo;
      goto LAB_00123611;
    }
    eof_error::eof_error((eof_error *)this_00,"expected element name or prefix",*text);
  }
  else {
    if (cVar2 == ':') {
      node->m_prefix = pcVar3;
      node->m_prefix_size = sVar4;
      pcVar6 = *text;
      pcVar3 = pcVar6 + 1;
      *text = pcVar3;
      lVar5 = 1;
      do {
        pbVar1 = (byte *)(pcVar6 + 1);
        pcVar6 = pcVar6 + 1;
        lVar5 = lVar5 + -1;
      } while (internal::lookup_tables<0>::lookup_node_name[*pbVar1] != '\0');
      *text = pcVar6;
      if (lVar5 == 0) {
        cVar2 = *pcVar6;
        this_00 = (parse_error *)__cxa_allocate_exception(0x18);
        if (cVar2 != '\0') {
          parse_error::parse_error(this_00,"expected element local name",*text);
          goto LAB_0012360a;
        }
        eof_error::eof_error((eof_error *)this_00,"expected element local name",*text);
        goto LAB_001235d6;
      }
      sVar4 = -lVar5;
    }
    (node->super_xml_base<char>).m_name = pcVar3;
    (node->super_xml_base<char>).m_name_size = sVar4;
    pcVar3 = *text + -1;
    do {
      pbVar1 = (byte *)(pcVar3 + 1);
      pcVar3 = pcVar3 + 1;
    } while (internal::lookup_tables<0>::lookup_whitespace[*pbVar1] != '\0');
    *text = pcVar3;
    parse_node_attributes<0>(this,text,node);
    pcVar3 = *text;
    cVar2 = *pcVar3;
    if (cVar2 == '/') {
      *text = pcVar3 + 1;
      if (pcVar3[1] == '>') {
        *text = pcVar3 + 2;
        goto LAB_001234df;
      }
      if (pcVar3[1] != '\0') {
        this_00 = (parse_error *)__cxa_allocate_exception(0x18);
        parse_error::parse_error(this_00,"expected >",*text);
        goto LAB_0012360a;
      }
      this_00 = (parse_error *)__cxa_allocate_exception(0x18);
      eof_error::eof_error((eof_error *)this_00,"expected >",*text);
    }
    else {
      if (cVar2 == '>') {
        pcVar3 = pcVar3 + 1;
        *text = pcVar3;
        pcVar6 = parse_node_contents<0>(this,text,node);
        if ((long)pcVar6 - (long)pcVar3 != 0) {
          node->m_contents = pcVar3;
          node->m_contents_size = (long)pcVar6 - (long)pcVar3;
        }
LAB_001234df:
        pcVar3 = (node->super_xml_base<char>).m_name;
        pcVar6 = pcVar3;
        if (pcVar3 != (char *)0x0) {
          pcVar6 = (char *)(node->super_xml_base<char>).m_name_size;
        }
        pcVar3[(long)pcVar6] = '\0';
        if (node->m_prefix != (char *)0x0) {
          node->m_prefix[node->m_prefix_size] = '\0';
        }
        return node;
      }
      if (cVar2 != '\0') {
        this_00 = (parse_error *)__cxa_allocate_exception(0x18);
        parse_error::parse_error(this_00,"expected >",*text);
        goto LAB_0012360a;
      }
      this_00 = (parse_error *)__cxa_allocate_exception(0x18);
      eof_error::eof_error((eof_error *)this_00,"expected >",*text);
    }
  }
LAB_001235d6:
  ppuVar7 = &eof_error::typeinfo;
LAB_00123611:
  __cxa_throw(this_00,ppuVar7,std::runtime_error::~runtime_error);
}

Assistant:

xml_node<Ch> *parse_element(Ch *&text)
        {
            // Create element node
            xml_node<Ch> *element = this->allocate_node(node_element);

            // Extract element name
            Ch *prefix = text;
            skip<element_name_pred, Flags>(text);
            if (text == prefix)
                RAPIDXML_PARSE_ERROR("expected element name or prefix", text);
            if (*text == Ch(':')) {
                element->prefix(prefix, text - prefix);
                ++text;
                Ch *name = text;
                skip<node_name_pred, Flags>(text);
                if (text == name)
                    RAPIDXML_PARSE_ERROR("expected element local name", text);
                element->name(name, text - name);
            } else {
                element->name(prefix, text - prefix);
            }

            // Skip whitespace between element name and attributes or >
            skip<whitespace_pred, Flags>(text);

            // Parse attributes, if any
            parse_node_attributes<Flags>(text, element);

            // Determine ending type
            if (*text == Ch('>'))
            {
                Ch const * contents = ++text;
                Ch const * contents_end = 0;
                if (!(Flags & parse_open_only))
                    contents_end = parse_node_contents<Flags>(text, element);
                std::size_t sz = contents_end - contents;
                if (sz) element->contents(contents, sz);
            }
            else if (*text == Ch('/'))
            {
                ++text;
                if (*text != Ch('>'))
                    RAPIDXML_PARSE_ERROR("expected >", text);
                ++text;
                if (Flags & parse_open_only)
                    RAPIDXML_PARSE_ERROR("open_only, but closed", text);
            }
            else
                RAPIDXML_PARSE_ERROR("expected >", text);

            // Place zero terminator after name
            if (!(Flags & parse_no_string_terminators)) {
                element->name()[element->name_size()] = Ch('\0');
                if (element->prefix()) element->prefix()[element->prefix_size()] = Ch('\0');
            }

            // Return parsed element
            return element;
        }